

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O2

int evutil_inet_pton(int af,char *src,void *dst)

{
  byte bVar1;
  ushort uVar2;
  uint8_t u_1;
  int iVar3;
  byte *pbVar4;
  size_t sVar5;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  in_addr *addr;
  byte *pbVar10;
  void *__src;
  uint d;
  uint c;
  char more_1;
  uint b;
  undefined4 uStack_64;
  char more;
  uint a;
  ushort local_4c;
  ushort local_4a;
  byte *local_48;
  void *local_40;
  ulong local_38;
  
  if (af == 10) {
    pbVar4 = (byte *)strchr(src,0x2e);
    if (pbVar4 == (byte *)src) {
      return 0;
    }
    local_48 = pbVar4;
    local_40 = dst;
    if (pbVar4 == (byte *)0x0) {
      sVar5 = strlen(src);
      pbVar10 = (byte *)(src + sVar5);
      uVar6 = 0;
    }
    else {
      do {
        pbVar10 = pbVar4;
        pbVar4 = pbVar10 + -1;
        if (pbVar4 < src) break;
      } while ((EVUTIL_ISDIGIT_TABLE[*pbVar4 >> 5] >> (*pbVar4 & 0x1f) & 1) != 0);
      iVar3 = __isoc99_sscanf(pbVar10,"%u.%u.%u.%u%c",&b,&c,&d,&more,&more_1);
      if (iVar3 != 4) {
        return 0;
      }
      if ((0xff < _more || 0xff < d) || (0xff < c || 0xff < b)) {
        return 0;
      }
      local_4c = (ushort)(b << 8) | (ushort)c;
      local_4a = (ushort)(d << 8) | (ushort)_more;
      uVar6 = 2;
    }
    uVar8 = 0;
    uVar7 = 0xffffffff;
    while (src < pbVar10) {
      if (7 < (int)uVar8) {
        return 0;
      }
      bVar1 = *src;
      if ((EVUTIL_ISXDIGIT_TABLE[bVar1 >> 5] >> (bVar1 & 0x1f) & 1) == 0) {
        if (((bVar1 == 0x3a) && (0 < (int)uVar8)) && (uVar7 == 0xffffffff)) {
          src = (char *)((byte *)src + 1);
          uVar7 = uVar8;
        }
        else {
          if (bVar1 != 0x3a) {
            return 0;
          }
          if (uVar8 != 0) {
            return 0;
          }
          if (((byte *)src)[1] != 0x3a) {
            return 0;
          }
          if (uVar7 != 0xffffffff) {
            return 0;
          }
          src = (char *)((byte *)src + 2);
          uVar8 = 0;
          uVar7 = 0;
        }
      }
      else {
        local_38 = uVar6;
        uVar6 = strtol(src,(char **)&b,0x10);
        pbVar4 = (byte *)CONCAT44(uStack_64,b);
        if ((byte *)src + 4 < pbVar4) {
          return 0;
        }
        if ((byte *)src == pbVar4) {
          return 0;
        }
        if (0x10000 < uVar6) {
          return 0;
        }
        lVar9 = (long)(int)uVar8;
        uVar8 = uVar8 + 1;
        *(short *)((long)&a + lVar9 * 2) = (short)uVar6;
        uVar6 = (ulong)((int)local_38 + 1);
        src = (char *)(pbVar4 + 1);
        if ((pbVar4 != pbVar10) && (*pbVar4 != 0x3a)) {
          return 0;
        }
      }
    }
    uVar8 = (uint)uVar6;
    if (8 < uVar8) {
      return 0;
    }
    if (uVar8 == 8 && uVar7 != 0xffffffff) {
      return 0;
    }
    if (uVar8 != 8 && uVar7 == 0xffffffff) {
      return 0;
    }
    if (-1 < (int)uVar7) {
      iVar3 = ((uVar8 + (uint)(local_48 == (byte *)0x0) * 2) - uVar7) + -2;
      if (iVar3 < 0) goto LAB_001ca934;
      __src = (void *)((long)&a + (ulong)uVar7 * 2);
      memmove((void *)((long)&a + (ulong)((8 - uVar8) + uVar7) * 2),__src,(ulong)(uint)(iVar3 * 2));
      memset(__src,0,(ulong)(8 - uVar8) * 2);
    }
    iVar3 = 1;
    for (lVar9 = 0; lVar9 != 8; lVar9 = lVar9 + 1) {
      uVar2 = *(ushort *)((long)&a + lVar9 * 2);
      *(ushort *)((long)local_40 + lVar9 * 2) = uVar2 << 8 | uVar2 >> 8;
    }
  }
  else {
    if (af == 2) {
      iVar3 = __isoc99_sscanf(src,"%u.%u.%u.%u%c",&a,&b,&c,&d,&more);
      if (iVar3 != 4) {
        return 0;
      }
      if (0xff < a) {
        return 0;
      }
      if (0xff < b) {
        return 0;
      }
      if (0xff < c) {
        return 0;
      }
      if (0xff < d) {
        return 0;
      }
      uVar7 = c << 8 | d;
      uVar8 = uVar7 | b << 0x10 | a << 0x18;
      *(uint *)dst = uVar8 >> 0x18 | (uVar8 & 0xff0000) >> 8 | (uVar7 & 0xff00) << 8 | d << 0x18;
      return 1;
    }
LAB_001ca934:
    iVar3 = -1;
  }
  return iVar3;
}

Assistant:

int
evutil_inet_pton(int af, const char *src, void *dst)
{
#if defined(EVENT__HAVE_INET_PTON) && !defined(USE_INTERNAL_PTON)
	return inet_pton(af, src, dst);
#else
	if (af == AF_INET) {
		unsigned a,b,c,d;
		char more;
		struct in_addr *addr = dst;
		if (sscanf(src, "%u.%u.%u.%u%c", &a,&b,&c,&d,&more) != 4)
			return 0;
		if (a > 255) return 0;
		if (b > 255) return 0;
		if (c > 255) return 0;
		if (d > 255) return 0;
		addr->s_addr = htonl((a<<24) | (b<<16) | (c<<8) | d);
		return 1;
#ifdef AF_INET6
	} else if (af == AF_INET6) {
		struct in6_addr *out = dst;
		ev_uint16_t words[8];
		int gapPos = -1, i, setWords=0;
		const char *dot = strchr(src, '.');
		const char *eow; /* end of words. */
		if (dot == src)
			return 0;
		else if (!dot)
			eow = src+strlen(src);
		else {
			unsigned byte1,byte2,byte3,byte4;
			char more;
			for (eow = dot-1; eow >= src && EVUTIL_ISDIGIT_(*eow); --eow)
				;
			++eow;

			/* We use "scanf" because some platform inet_aton()s are too lax
			 * about IPv4 addresses of the form "1.2.3" */
			if (sscanf(eow, "%u.%u.%u.%u%c",
					   &byte1,&byte2,&byte3,&byte4,&more) != 4)
				return 0;

			if (byte1 > 255 ||
			    byte2 > 255 ||
			    byte3 > 255 ||
			    byte4 > 255)
				return 0;

			words[6] = (byte1<<8) | byte2;
			words[7] = (byte3<<8) | byte4;
			setWords += 2;
		}

		i = 0;
		while (src < eow) {
			if (i > 7)
				return 0;
			if (EVUTIL_ISXDIGIT_(*src)) {
				char *next;
				long r = strtol(src, &next, 16);
				if (next > 4+src)
					return 0;
				if (next == src)
					return 0;
				if (r<0 || r>65536)
					return 0;

				words[i++] = (ev_uint16_t)r;
				setWords++;
				src = next;
				if (*src != ':' && src != eow)
					return 0;
				++src;
			} else if (*src == ':' && i > 0 && gapPos==-1) {
				gapPos = i;
				++src;
			} else if (*src == ':' && i == 0 && src[1] == ':' && gapPos==-1) {
				gapPos = i;
				src += 2;
			} else {
				return 0;
			}
		}

		if (setWords > 8 ||
			(setWords == 8 && gapPos != -1) ||
			(setWords < 8 && gapPos == -1))
			return 0;

		if (gapPos >= 0) {
			int nToMove = setWords - (dot ? 2 : 0) - gapPos;
			int gapLen = 8 - setWords;
			/* assert(nToMove >= 0); */
			if (nToMove < 0)
				return -1; /* should be impossible */
			memmove(&words[gapPos+gapLen], &words[gapPos],
					sizeof(ev_uint16_t)*nToMove);
			memset(&words[gapPos], 0, sizeof(ev_uint16_t)*gapLen);
		}
		for (i = 0; i < 8; ++i) {
			out->s6_addr[2*i  ] = words[i] >> 8;
			out->s6_addr[2*i+1] = words[i] & 0xff;
		}

		return 1;
#endif
	} else {
		return -1;
	}
#endif
}